

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketImpl::receive(WebSocketImpl *this)

{
  ulong uVar1;
  uchar *puVar2;
  byte bVar3;
  Array<unsigned_char> *__begin4;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  TransformPromiseNodeBase *pTVar6;
  long lVar7;
  byte bVar8;
  undefined4 uVar9;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  Array<unsigned_char> *fragment_1;
  _func_int *p_Var10;
  Disposer *in_RSI;
  PromiseNode *pPVar11;
  uint uVar12;
  PromiseNode *pPVar13;
  _func_int **pp_Var14;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar15;
  byte local_ea;
  Array<unsigned_char> message;
  Own<kj::_::PromiseNode> intermediate_1;
  Own<kj::_::PromiseNode> local_b8;
  Own<kj::_::PromiseNode> intermediate;
  undefined4 uStack_84;
  Array<unsigned_char> local_80;
  Own<kj::_::PromiseNode> local_68;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2197:17),_unsigned_long>
  promise;
  Vector<kj::Array<unsigned_char>_> *__range4;
  
  pp_Var14 = in_RSI[0x1a]._vptr_Disposer;
  pp_Var5 = in_RSI[0x1b]._vptr_Disposer;
  if (pp_Var5 < (_func_int **)0x2) {
    pp_Var4 = (_func_int **)0x2;
  }
  else {
    lVar7 = (ulong)((byte)*(code *)((long)pp_Var14 + 1) >> 7) * 4;
    pp_Var4 = (_func_int **)(lVar7 + 2);
    bVar8 = (byte)*(code *)((long)pp_Var14 + 1) & 0x7f;
    if (bVar8 == 0x7e) {
      pp_Var4 = (_func_int **)(lVar7 + 4);
    }
    else if (bVar8 == 0x7f) {
      pp_Var4 = (_func_int **)((ulong)pp_Var4 | 8);
    }
  }
  if (pp_Var5 < pp_Var4) {
    pp_Var4 = in_RSI[0x17]._vptr_Disposer;
    if (pp_Var14 != pp_Var4) {
      if (pp_Var5 == (_func_int **)0x0) {
        pp_Var5 = (_func_int **)0x0;
        pp_Var14 = pp_Var4;
      }
      else {
        memmove(pp_Var4,pp_Var14,(size_t)pp_Var5);
        pp_Var5 = in_RSI[0x1b]._vptr_Disposer;
        pp_Var14 = in_RSI[0x17]._vptr_Disposer;
      }
      in_RSI[0x1a]._vptr_Disposer = pp_Var14;
      in_RSI[0x1b]._vptr_Disposer = pp_Var5;
      pp_Var4 = pp_Var14;
    }
    (**(code **)(*in_RSI[2]._vptr_Disposer + 8))
              (&local_b8,in_RSI[2]._vptr_Disposer,(_func_int *)((long)pp_Var5 + (long)pp_Var14),1,
               (long)((long)pp_Var4 + (long)in_RSI[0x18]._vptr_Disposer) -
               ((long)pp_Var5 + (long)pp_Var14));
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_b8,
               _::
               TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2069:17),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428a58;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)pTVar6;
    _::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              (&intermediate_1,
               (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               &intermediate);
    pPVar13 = intermediate_1.ptr;
    message.ptr = (uchar *)intermediate_1.disposer;
    intermediate_1.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&intermediate_1);
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)intermediate_1.disposer;
    (this->stream).disposer = (Disposer *)pPVar13;
    message.size_ = 0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&message);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&local_b8);
    pPVar13 = extraout_RDX;
    goto LAB_002abe95;
  }
  in_RSI[0x1a]._vptr_Disposer = (_func_int **)((long)pp_Var4 + (long)pp_Var14);
  in_RSI[0x1b]._vptr_Disposer = (_func_int **)((long)pp_Var5 - (long)pp_Var4);
  uVar12 = (byte)*(code *)((long)pp_Var14 + 1) & 0x7f;
  pPVar13 = (PromiseNode *)(ulong)uVar12;
  if (pPVar13 == (PromiseNode *)0x7e) {
    pPVar13 = (PromiseNode *)
              (ulong)(ushort)(*(ushort *)((long)pp_Var14 + 2) << 8 |
                             *(ushort *)((long)pp_Var14 + 2) >> 8);
  }
  else if (uVar12 == 0x7f) {
    uVar1 = *(ulong *)((long)pp_Var14 + 2);
    pPVar13 = (PromiseNode *)
              (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  }
  bVar8 = *(byte *)pp_Var14;
  bVar3 = bVar8 & 0xf;
  if (bVar3 == 0) {
    if (in_RSI[0x14]._vptr_Disposer == in_RSI[0x13]._vptr_Disposer) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)&intermediate,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x82e,FAILED,"!fragments.empty()","\"unexpected continuation frame in WebSocket\""
                 ,(char (*) [43])"unexpected continuation frame in WebSocket");
      _::Debug::Fault::fatal((Fault *)&intermediate);
    }
    local_ea = *(byte *)&in_RSI[0x12]._vptr_Disposer;
  }
  else {
    local_ea = bVar3;
    if ((bVar3 < 8) && (in_RSI[0x14]._vptr_Disposer != in_RSI[0x13]._vptr_Disposer)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                ((Fault *)&intermediate,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x832,FAILED,"fragments.empty()","\"expected continuation frame in WebSocket\"",
                 (char (*) [41])0x36d3ad);
      _::Debug::Fault::fatal((Fault *)&intermediate);
    }
  }
  message.disposer = (ArrayDisposer *)0x0;
  message.ptr = (uchar *)0x0;
  message.size_ = 0;
  if ((char)bVar8 < '\0') {
    pPVar11 = (PromiseNode *)((long)&pPVar13->_vptr_PromiseNode + (ulong)(local_ea == 1));
    if (bVar3 < 8) {
      pp_Var5 = in_RSI[0x13]._vptr_Disposer;
      if (in_RSI[0x14]._vptr_Disposer != pp_Var5) {
        p_Var10 = (_func_int *)0x0;
        for (; pp_Var5 != in_RSI[0x14]._vptr_Disposer; pp_Var5 = pp_Var5 + 3) {
          p_Var10 = p_Var10 + (long)pp_Var5[1];
        }
        pPVar11 = (PromiseNode *)((long)&pPVar11->_vptr_PromiseNode + (long)p_Var10);
        intermediate.disposer =
             (Disposer *)_::HeapArrayDisposer::allocate<unsigned_char>((size_t)pPVar11);
        intermediate.ptr = pPVar11;
        Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&intermediate);
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&intermediate);
        pp_Var4 = in_RSI[0x14]._vptr_Disposer;
        p_Var10 = (_func_int *)0x0;
        for (pp_Var5 = in_RSI[0x13]._vptr_Disposer; puVar2 = message.ptr, pp_Var5 != pp_Var4;
            pp_Var5 = pp_Var5 + 3) {
          memcpy(message.ptr + (long)p_Var10,*pp_Var5,(size_t)pp_Var5[1]);
          p_Var10 = p_Var10 + (long)pp_Var5[1];
        }
        ArrayBuilder<kj::Array<unsigned_char>_>::clear
                  ((ArrayBuilder<kj::Array<unsigned_char>_> *)(in_RSI + 0x13));
        *(undefined4 *)&in_RSI[0x12]._vptr_Disposer = 0;
        pPVar11 = (PromiseNode *)(puVar2 + (long)p_Var10);
        goto LAB_002abc3a;
      }
    }
    intermediate.disposer =
         (Disposer *)_::HeapArrayDisposer::allocate<unsigned_char>((size_t)pPVar11);
    intermediate.ptr = pPVar11;
    Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&intermediate);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&intermediate);
    pPVar11 = (PromiseNode *)message.ptr;
  }
  else {
    if (7 < bVar3) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                ((Fault *)&intermediate,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x853,FAILED,"isData","\"WebSocket control frame cannot be fragmented\"",
                 (char (*) [45])"WebSocket control frame cannot be fragmented");
      _::Debug::Fault::fatal((Fault *)&intermediate);
    }
    intermediate.disposer =
         (Disposer *)_::HeapArrayDisposer::allocate<unsigned_char>((size_t)pPVar13);
    intermediate.ptr = pPVar13;
    Array<unsigned_char>::operator=(&message,(Array<unsigned_char> *)&intermediate);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&intermediate);
    pPVar11 = (PromiseNode *)message.ptr;
    if (in_RSI[0x14]._vptr_Disposer == in_RSI[0x13]._vptr_Disposer) {
      *(uint *)&in_RSI[0x12]._vptr_Disposer = (uint)local_ea;
    }
  }
LAB_002abc3a:
  uVar9 = 0;
  if ((char)*(code *)((long)pp_Var14 + 1) < '\0') {
    bVar3 = (byte)*(code *)((long)pp_Var14 + 1) & 0x7f;
    lVar7 = 10;
    if (bVar3 != 0x7f) {
      lVar7 = (ulong)(bVar3 == 0x7e) * 2 + 2;
    }
    uVar9 = *(undefined4 *)((long)pp_Var14 + lVar7);
  }
  intermediate.ptr = (PromiseNode *)CONCAT71(intermediate.ptr._1_7_,local_ea);
  uStack_84 = CONCAT31(uStack_84._1_3_,bVar8 >> 7);
  local_80.ptr = message.ptr;
  local_80.size_ = message.size_;
  local_80.disposer = message.disposer;
  message.ptr = (uchar *)0x0;
  message.size_ = 0;
  if ((PromiseNode *)in_RSI[0x1b]._vptr_Disposer < pPVar13) {
    intermediate.disposer = in_RSI;
    memcpy(pPVar11,in_RSI[0x1a]._vptr_Disposer,(size_t)in_RSI[0x1b]._vptr_Disposer);
    pp_Var14 = (_func_int **)((long)pPVar13 - (long)in_RSI[0x1b]._vptr_Disposer);
    (**(code **)(*in_RSI[2]._vptr_Disposer + 8))
              (&local_68,in_RSI[2]._vptr_Disposer,
               (_func_int *)((long)&pPVar11->_vptr_PromiseNode + (long)in_RSI[0x1b]._vptr_Disposer),
               pp_Var14,pp_Var14);
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_68,
               _::
               TransformPromiseNode<kj::_::Void,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2197:17),_kj::_::PropagateException>
               ::anon_class_8_1_49713496_for_func::operator());
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428ae0;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = pp_Var14;
    intermediate_1.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    local_b8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    intermediate_1.ptr = (PromiseNode *)0x0;
    promise.super_PromiseBase.node.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    local_b8.ptr = (PromiseNode *)0x0;
    promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar6;
    Own<kj::_::PromiseNode>::dispose(&local_b8);
    Own<kj::_::PromiseNode>::dispose(&intermediate_1);
    Own<kj::_::PromiseNode>::dispose(&local_68);
    in_RSI[0x1a]._vptr_Disposer = (_func_int **)0x0;
    in_RSI[0x1b]._vptr_Disposer = (_func_int **)0x0;
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x68);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(Own<kj::_::PromiseNode> *)&promise,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
               ::operator()<>);
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428b68;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)intermediate.disposer;
    pTVar6[1].dependency.disposer = (Disposer *)intermediate.ptr;
    pTVar6[1].dependency.ptr = pPVar11;
    pTVar6[1].continuationTracePtr = pPVar13;
    pTVar6[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)CONCAT44(uStack_84,uVar9);
    pTVar6[2].dependency.disposer = (Disposer *)local_80.ptr;
    pTVar6[2].dependency.ptr = (PromiseNode *)local_80.size_;
    pTVar6[2].continuationTracePtr = local_80.disposer;
    local_80.ptr = (uchar *)0x0;
    local_80.size_ = 0;
    intermediate_1.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(kj::Array<unsigned_char>&&)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
          ::instance;
    intermediate_1.ptr = (PromiseNode *)pTVar6;
    _::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              (&local_68,
               (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               &intermediate_1);
    pPVar13 = local_68.ptr;
    local_b8.disposer = local_68.disposer;
    local_68.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_68);
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)local_68.disposer;
    (this->stream).disposer = (Disposer *)pPVar13;
    local_b8.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_b8);
    Own<kj::_::PromiseNode>::dispose(&intermediate_1);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  }
  else {
    memcpy(pPVar11,in_RSI[0x1a]._vptr_Disposer,(size_t)pPVar13);
    in_RSI[0x1a]._vptr_Disposer = (_func_int **)((long)in_RSI[0x1a]._vptr_Disposer + (long)pPVar13);
    in_RSI[0x1b]._vptr_Disposer = (_func_int **)((long)in_RSI[0x1b]._vptr_Disposer - (long)pPVar13);
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
    ::operator()<>((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                    *)this);
  }
  Array<unsigned_char>::~Array(&local_80);
  Array<unsigned_char>::~Array(&message);
  pPVar13 = extraout_RDX_00;
LAB_002abe95:
  PVar15.super_PromiseBase.node.ptr = pPVar13;
  PVar15.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar15.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.slice(0, recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this](size_t actual) -> kj::Promise<Message> {
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.slice(0, recvData.size() + actual);
        return receive();
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      KJ_REQUIRE(!fragments.empty(), "unexpected continuation frame in WebSocket");

      opcode = fragmentOpcode;
    } else if (isData) {
      KJ_REQUIRE(fragments.empty(), "expected continuation frame in WebSocket");
    }

    bool isFin = recvHeader.isFin();

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    if (isFin) {
      // Add space for NUL terminator when allocating text message.
      size_t amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      KJ_REQUIRE(isData, "WebSocket control frame cannot be fragmented");

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage = kj::mvCapture(message,
        [this,opcode,payloadTarget,payloadLen,mask,isFin]
        (kj::Array<byte>&& message) -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        fragments.add(kj::mv(message));
        return receive();
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive();
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive();
        default:
          KJ_FAIL_REQUIRE("unknown WebSocket opcode", opcode);
      }
    });

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([remaining](size_t amount) {
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }